

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall MlmWrap::provideEvent(MlmWrap *this,char *event)

{
  mutex *__mutex;
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  pointer unaff_R15;
  zmsg_t *msg;
  zmsg_t *local_68;
  string local_60;
  string local_40;
  
  local_68 = czhelp_zmsg_create("ss","EVP",event);
  __mutex = &this->actormutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    iVar1 = zactor_send(this->actor,&local_68);
    if (iVar1 != 0) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Could not send \'provide event\' to actor","");
      error(&local_40,this,&local_60);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_40._M_dataplus._M_p,local_40._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar1;
  }
  uVar3 = std::__throw_system_error(iVar1);
  if (local_60._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

int MlmWrap::provideEvent(const char *event){
    int rc = -1;
    zmsg_t *msg = czhelp_zmsg_create("ss", eventprovide, event);
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &msg);
    if(rc){
        std::cerr << error("Could not send 'provide event' to actor") << std::endl;;
    }
    return rc;
}